

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

bool __thiscall QDirListingPrivate::hasIterators(QDirListingPrivate *this)

{
  bool bVar1;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x2956ab);
  if (bVar1) {
    bVar1 = std::
            vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
            ::empty((vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  else {
    bVar1 = std::
            vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
            ::empty((vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool QDirListingPrivate::hasIterators() const
{
    if (engine)
        return !fileEngineIterators.empty();

#if !defined(QT_NO_FILESYSTEMITERATOR)
    return !nativeIterators.empty();
#endif

    return false;
}